

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merger.cc
# Opt level: O1

void __thiscall leveldb::anon_unknown_0::MergingIterator::SeekToLast(MergingIterator *this)

{
  long lVar1;
  long lVar2;
  
  if (0 < this->n_) {
    lVar1 = 0;
    lVar2 = 0;
    do {
      IteratorWrapper::SeekToLast((IteratorWrapper *)((long)&this->children_->iter_ + lVar1));
      lVar2 = lVar2 + 1;
      lVar1 = lVar1 + 0x20;
    } while (lVar2 < this->n_);
  }
  FindLargest(this);
  this->direction_ = kReverse;
  return;
}

Assistant:

void SeekToLast() override {
    for (int i = 0; i < n_; i++) {
      children_[i].SeekToLast();
    }
    FindLargest();
    direction_ = kReverse;
  }